

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetScanFilter::ParquetScanFilter
          (ParquetScanFilter *this,ClientContext *context,idx_t filter_idx,TableFilter *filter)

{
  _Head_base<0UL,_duckdb::TableFilterState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableFilterState_*,_false> _Var2;
  TableFilterState *in_RAX;
  _Head_base<0UL,_duckdb::TableFilterState_*,_false> local_18;
  
  this->filter_idx = filter_idx;
  this->filter = filter;
  (this->filter_state).
  super_unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
  .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl = (TableFilterState *)0x0;
  local_18._M_head_impl = in_RAX;
  TableFilterState::Initialize((TableFilterState *)&local_18,context,filter);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (TableFilterState *)0x0;
  _Var1._M_head_impl =
       (this->filter_state).
       super_unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
       .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl;
  (this->filter_state).
  super_unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
  .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (TableFilterState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_TableFilterState[1])();
    if (local_18._M_head_impl != (TableFilterState *)0x0) {
      (*(local_18._M_head_impl)->_vptr_TableFilterState[1])();
    }
  }
  return;
}

Assistant:

ParquetScanFilter::ParquetScanFilter(ClientContext &context, idx_t filter_idx, TableFilter &filter)
    : filter_idx(filter_idx), filter(filter) {
	filter_state = TableFilterState::Initialize(context, filter);
}